

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::option::
option<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>
          (option *this,cstring *name,
          named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
          *m)

{
  basic_cstring<const_char> *in_RSI;
  undefined8 *in_RDI;
  named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
  *in_stack_00000048;
  bool in_stack_00000056;
  bool in_stack_00000057;
  cstring *in_stack_00000058;
  basic_param *in_stack_00000060;
  named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
  *np;
  keyword<boost::runtime::(anonymous_namespace)::optional_value_t,_false> *in_stack_fffffffffffffe88
  ;
  named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
  *m_00;
  argument_factory<bool,_false,_false> *this_00;
  argument_factory<bool,_false,_false> local_a0 [7];
  undefined1 local_89;
  named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
  local_88;
  named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
  local_78;
  basic_cstring<const_char> local_28 [2];
  
  unit_test::basic_cstring<const_char>::basic_cstring(local_28,in_RSI);
  local_89 = 1;
  np = &local_88;
  nfp::keyword<boost::runtime::(anonymous_namespace)::optional_value_t,false>::operator=
            (in_stack_fffffffffffffe88,(bool *)np);
  m_00 = &local_78;
  nfp::
  opt_append<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>>
            ((named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)m_00,np);
  this_00 = local_a0;
  nfp::keyword<boost::runtime::(anonymous_namespace)::default_value_t,false>::operator=
            ((keyword<boost::runtime::(anonymous_namespace)::default_value_t,_false> *)m_00,
             (bool *)np);
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>>
            (&m_00->
              super_named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
             ,(named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
               *)np);
  basic_param::
  basic_param<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>
            (in_stack_00000060,in_stack_00000058,in_stack_00000057,in_stack_00000056,
             in_stack_00000048);
  *in_RDI = &PTR__option_00302bf0;
  nfp::keyword<boost::runtime::(anonymous_namespace)::optional_value_t,false>::operator=
            ((keyword<boost::runtime::(anonymous_namespace)::optional_value_t,_false> *)m_00,
             (bool *)np);
  nfp::
  opt_append<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>>
            ((named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)m_00,np);
  nfp::keyword<boost::runtime::(anonymous_namespace)::default_value_t,false>::operator=
            ((keyword<boost::runtime::(anonymous_namespace)::default_value_t,_false> *)m_00,
             (bool *)np);
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>>
            (&m_00->
              super_named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
             ,(named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
               *)np);
  argument_factory<bool,false,false>::
  argument_factory<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>
            (this_00,m_00);
  return;
}

Assistant:

option( cstring name, Modifiers const& m )
#endif
    : basic_param( name, true, false, nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    , m_arg_factory( nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    {
    }